

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int Correct(string *modelFile)

{
  string *text;
  wstring *__return_storage_ptr__;
  uint64_t uVar1;
  unique_ptr<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_> uVar2;
  bool bVar3;
  char cVar4;
  istream *piVar5;
  ostream *poVar6;
  int iVar7;
  undefined1 local_1d0 [8];
  TSpellCorrector corrector;
  wstring wtext;
  wstring result;
  string line;
  long local_48;
  undefined1 local_40 [16];
  
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_1d0);
  corrector.LangModel.CheckSum = 0;
  corrector.Deletes1._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>._M_t
  .super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>.
  super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
       (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
        )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
         0x0;
  corrector.Deletes2._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>._M_t
  .super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>.
  super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
       (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
        )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
         0x4034000000000000;
  corrector.KnownWordsPenalty = 5.0;
  corrector.UnknownWordsPenalty = 6.91691904177745e-323;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[info] loading model",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  bVar3 = NJamSpell::TSpellCorrector::LoadLangModel((TSpellCorrector *)local_1d0,modelFile);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[info] loaded",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,">> ",3);
    result.field_2._8_8_ = &line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    text = (string *)((long)&result.field_2 + 8);
    __return_storage_ptr__ = (wstring *)((long)&wtext.field_2 + 8);
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)text,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      NJamSpell::UTF8ToWide((wstring *)&corrector.MaxCandiatesToCheck,text);
      NJamSpell::TSpellCorrector::FixFragment
                (__return_storage_ptr__,(TSpellCorrector *)local_1d0,
                 (wstring *)&corrector.MaxCandiatesToCheck);
      NJamSpell::WideToUTF8((string *)((long)&line.field_2 + 8),__return_storage_ptr__);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)line.field_2._8_8_,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((undefined1 *)line.field_2._8_8_ != local_40) {
        operator_delete((void *)line.field_2._8_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,">> ",3);
      if ((size_type *)wtext.field_2._8_8_ != &result._M_string_length) {
        operator_delete((void *)wtext.field_2._8_8_);
      }
      if ((size_type *)corrector.MaxCandiatesToCheck != &wtext._M_string_length) {
        operator_delete((void *)corrector.MaxCandiatesToCheck);
      }
    }
    if ((size_type *)result.field_2._8_8_ != &line._M_string_length) {
      operator_delete((void *)result.field_2._8_8_);
    }
    iVar7 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[error] failed to load model",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    iVar7 = 0x2a;
    std::ostream::flush();
  }
  uVar2._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>._M_t
  .super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>.
  super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
       corrector.Deletes1._M_t.
       super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
       ._M_t.
       super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
       .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
      corrector.Deletes1._M_t.
      super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>.
      _M_t.
      super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
      .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)0x0)
  {
    NJamSpell::TBloomFilter::~TBloomFilter
              ((TBloomFilter *)
               corrector.Deletes1._M_t.
               super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
               .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
    operator_delete((void *)uVar2._M_t.
                            super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>
                            .super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl);
  }
  uVar1 = corrector.LangModel.CheckSum;
  corrector.Deletes1._M_t.
  super___uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>._M_t
  .super__Tuple_impl<0UL,_NJamSpell::TBloomFilter_*,_std::default_delete<NJamSpell::TBloomFilter>_>.
  super__Head_base<0UL,_NJamSpell::TBloomFilter_*,_false>._M_head_impl =
       (__uniq_ptr_data<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>,_true,_true>
        )(__uniq_ptr_impl<NJamSpell::TBloomFilter,_std::default_delete<NJamSpell::TBloomFilter>_>)
         0x0;
  if (corrector.LangModel.CheckSum != 0) {
    NJamSpell::TBloomFilter::~TBloomFilter((TBloomFilter *)corrector.LangModel.CheckSum);
    operator_delete((void *)uVar1);
  }
  corrector.LangModel.CheckSum = 0;
  local_1d0 = (undefined1  [8])&PTR_Dump_0012d960;
  NJamSpell::TPerfectHash::~TPerfectHash
            ((TPerfectHash *)
             &corrector.LangModel.Buckets.
              super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (corrector.LangModel.Tokenizer._64_8_ != 0) {
    operator_delete((void *)corrector.LangModel.Tokenizer._64_8_);
  }
  corrector.LangModel._128_8_ = &PTR_Dump_0012d9e8;
  std::locale::~locale((locale *)&corrector.LangModel.Tokenizer.Alphabet._M_h._M_single_bucket);
  std::
  _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&corrector.LangModel.Tokenizer);
  if (corrector.LangModel.WordToId.
      super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      .m_ht._56_8_ != 0) {
    operator_delete((void *)corrector.LangModel.WordToId.
                            super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                            .m_ht._56_8_);
  }
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
  ::~vector((vector<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>,_true>_>_>
             *)&corrector.LangModel.WordToId.
                super_robin_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_unsigned_int>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           );
  return iVar7;
}

Assistant:

int Correct(const std::string& modelFile) {
    TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }
    std::cerr << "[info] loaded" << std::endl;
    std::cerr << ">> ";
    for (std::string line; std::getline(std::cin, line);) {
        std::wstring wtext = UTF8ToWide(line);
        std::wstring result = corrector.FixFragment(wtext);
        std::cerr << WideToUTF8(result) << "\n";
        std::cerr << ">> ";
    }
    return 0;
}